

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GPUShaderFP64Test7::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,_variables *variables)

{
  uint uVar1;
  _variable_type type;
  _variable_type _Var2;
  pointer p_Var3;
  pointer p_Var4;
  pointer p_Var5;
  uchar uVar6;
  uint uVar7;
  uint uVar8;
  ostream *poVar9;
  ulong uVar10;
  _variable_type type_00;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  string variable_type_string;
  stringstream result_sstream;
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&result_sstream);
  std::operator<<(&local_1a8,"#version 400\n\n");
  if (this->m_are_double_inputs_supported == true) {
    pcVar14 = "#extension GL_ARB_vertex_attrib_64bit : require\n";
    poVar9 = std::operator<<(&local_1a8,"#extension GL_ARB_vertex_attrib_64bit : require\n");
    getVariableDeclarations_abi_cxx11_
              (&variable_type_string,(GPUShaderFP64Test7 *)pcVar14,"in_vs",variables,"in");
    std::operator<<(poVar9,(string *)&variable_type_string);
    std::__cxx11::string::~string((string *)&variable_type_string);
  }
  pcVar14 = "out VS_DATA\n{\n";
  poVar9 = std::operator<<(&local_1a8,"out VS_DATA\n{\n");
  getVariableDeclarations_abi_cxx11_
            (&variable_type_string,(GPUShaderFP64Test7 *)pcVar14,"vs",variables,
             glcts::fixed_sample_locations_values + 1);
  std::operator<<(poVar9,(string *)&variable_type_string);
  std::__cxx11::string::~string((string *)&variable_type_string);
  std::operator<<(&local_1a8,"};\n\nvoid main()\n{\n");
  p_Var3 = (variables->
           super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  p_Var4 = (variables->
           super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = 1;
  for (uVar11 = 0; uVar12 = (ulong)uVar11, uVar12 < (ulong)(((long)p_Var3 - (long)p_Var4) / 0xc);
      uVar11 = uVar11 + 1) {
    p_Var5 = (variables->
             super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar1 = p_Var5[uVar12].array_size;
    type = p_Var5[uVar12].type;
    uVar7 = Utils::getNumberOfComponentsForVariableType(type);
    Utils::getVariableTypeString_abi_cxx11_(&variable_type_string,(Utils *)(ulong)type,type_00);
    for (uVar10 = 0; uVar10 != uVar1; uVar10 = uVar10 + 1) {
      if (uVar1 == 1) {
        poVar9 = std::operator<<(&local_1a8,"vs_variable");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      }
      else {
        poVar9 = std::operator<<(&local_1a8,"vs_variable");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9,"[");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9,"]");
      }
      poVar9 = std::operator<<(poVar9," = ");
      poVar9 = std::operator<<(poVar9,(string *)&variable_type_string);
      std::operator<<(poVar9,"(");
      for (uVar15 = 0; uVar7 != uVar15; uVar15 = uVar15 + 1) {
        std::ostream::_M_insert<double>((double)(uVar15 + (uVar13 & 0xffffffff) & 0xffffffff));
        if (this->m_are_double_inputs_supported == true) {
          poVar9 = std::operator<<(&local_1a8," + in_vs_variable");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          if (1 < uVar1) {
            poVar9 = std::operator<<(&local_1a8,"[");
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            std::operator<<(poVar9,"]");
          }
          _Var2 = (variables->
                  super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar12].type;
          if ((_Var2 < VARIABLE_TYPE_UINT) &&
             ((0x7fc03fe0U >> (_Var2 & VARIABLE_TYPE_UINT) & 1) != 0)) {
            uVar8 = Utils::getNumberOfColumnsForVariableType(type);
            poVar9 = std::operator<<(&local_1a8,"[");
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            poVar9 = std::operator<<(poVar9,"].");
            uVar6 = Utils::getComponentAtIndex((uint)((uVar15 & 0xffffffff) / (ulong)uVar8));
            std::operator<<(poVar9,uVar6);
          }
          else if (1 < uVar7) {
            poVar9 = std::operator<<(&local_1a8,"[");
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            std::operator<<(poVar9,"]");
          }
        }
        if (uVar7 - 1 != uVar15) {
          std::operator<<(&local_1a8,", ");
        }
      }
      std::operator<<(&local_1a8,");\n");
      uVar13 = (uVar13 & 0xffffffff) + uVar15;
    }
    std::__cxx11::string::~string((string *)&variable_type_string);
  }
  std::operator<<(&local_1a8,"gl_Position = vec4(0, 0, 0, 1);\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&result_sstream);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test7::getVertexShaderBody(const _variables& variables)
{
	std::stringstream result_sstream;

	/* Form pre-amble */
	result_sstream << "#version 400\n"
					  "\n";

	/* Define input variables if GL_ARB_vertex_attrib_64bit is supported */
	if (m_are_double_inputs_supported)
	{
		result_sstream << "#extension GL_ARB_vertex_attrib_64bit : require\n"
					   << getVariableDeclarations("in_vs", variables, "in");
	}

	/* Define output variables */
	result_sstream << "out VS_DATA\n"
					  "{\n"
				   << getVariableDeclarations("vs", variables);

	/* Define main() */
	result_sstream << "};\n"
					  "\n"
					  "void main()\n"
					  "{\n";

	/* Set output variable values */
	unsigned int counter	 = 1;
	const size_t n_variables = variables.size();

	for (unsigned int n_variable = 0; n_variable < n_variables; ++n_variable)
	{
		unsigned int		  variable_array_size		 = variables[n_variable].array_size;
		Utils::_variable_type variable_type				 = variables[n_variable].type;
		const unsigned int	n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
		std::string			  variable_type_string		 = Utils::getVariableTypeString(variable_type);

		for (unsigned int index = 0; index < variable_array_size; ++index)
		{
			if (variable_array_size == 1)
			{
				result_sstream << "vs_variable" << n_variable << " = " << variable_type_string << "(";
			}
			else
			{
				result_sstream << "vs_variable" << n_variable << "[" << index << "]"
							   << " = " << variable_type_string << "(";
			}

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				result_sstream << (double)(counter++);

				/* Use input attributes, if available */
				if (m_are_double_inputs_supported)
				{
					result_sstream << " + in_vs_variable" << n_variable;

					if (variable_array_size > 1)
					{
						result_sstream << "[" << index << "]";
					}

					if (Utils::isMatrixVariableType(variables[n_variable].type))
					{
						const unsigned int n_columns = Utils::getNumberOfColumnsForVariableType(variable_type);
						const unsigned int column	= n_component % n_columns;
						const unsigned int row		 = n_component / n_columns;

						result_sstream << "[" << (column) << "]"
															 "."
									   << Utils::getComponentAtIndex(row);
					}
					else if (n_variable_type_components > 1)
					{
						result_sstream << "[" << n_component << "]";
					}
				}

				if (n_component != (n_variable_type_components - 1))
				{
					result_sstream << ", ";
				}
			} /* for (all components) */

			result_sstream << ");\n";
		}
	} /* for (all variable types) */

	/* We will be using geometry shader to lay out the actual vertices so
	 * the only thing we need to make sure is that the vertex never gets
	 * culled.
	 */
	result_sstream << "gl_Position = vec4(0, 0, 0, 1);\n"
					  "}\n";

	/* That's it */
	return result_sstream.str();
}